

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

int libtorrent::path_compare(string_view lhs,string_view lfile,string_view rhs,string_view rfile)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  undefined1 auVar1 [8];
  bool bVar2;
  int iVar3;
  char *pcVar4;
  string_view p;
  string_view p_00;
  string_view p_01;
  string_view p_02;
  byte local_131;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_118;
  char *local_f8;
  size_t local_f0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_e8;
  size_t local_c8;
  size_t local_c0;
  int local_b4;
  size_t sStack_b0;
  int ret;
  size_t local_a8;
  char *local_a0;
  char *local_98;
  undefined1 local_90 [8];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  rhs_elems;
  undefined1 local_60 [8];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  lhs_elems;
  string_view rhs_local;
  string_view lfile_local;
  string_view lhs_local;
  
  lhs_elems.second._M_str = (char *)rhs._M_len;
  rhs_elems.second._M_str = (char *)lhs._M_len;
  p._M_str = lfile._M_str;
  p._M_len = (size_t)lhs._M_str;
  pcVar4 = p._M_str;
  lsplit_path((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               *)local_60,(libtorrent *)rhs_elems.second._M_str,p);
  local_a0 = lhs_elems.second._M_str;
  p_00._M_str = pcVar4;
  p_00._M_len = (size_t)rhs._M_str;
  local_98 = rhs._M_str;
  lsplit_path((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               *)local_90,(libtorrent *)lhs_elems.second._M_str,p_00);
  while( true ) {
    bVar2 = ::std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_60);
    pcVar4 = (char *)CONCAT71((int7)((ulong)pcVar4 >> 8),bVar2);
    local_131 = 1;
    if (bVar2) {
      bVar2 = ::std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_90);
      local_131 = bVar2 ^ 0xff;
    }
    if ((local_131 & 1) == 0) break;
    bVar2 = ::std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_60);
    if ((bVar2) ||
       (bVar2 = ::std::basic_string_view<char,_std::char_traits<char>_>::empty
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_90), bVar2)) {
      bVar2 = ::std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_60);
      auVar1 = (undefined1  [8])lfile._M_len;
      pcVar4 = p._M_str;
      if (!bVar2) {
        auVar1 = local_60;
        pcVar4 = (char *)lhs_elems.first._M_len;
      }
      lhs_elems.first._M_len = (size_t)pcVar4;
      local_60 = auVar1;
      bVar2 = ::std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_90);
      if (bVar2) {
        local_90 = (undefined1  [8])rfile._M_len;
        rhs_elems.first._M_len = (size_t)rfile._M_str;
      }
      sStack_b0 = (size_t)local_90;
      local_a8 = rhs_elems.first._M_len;
      __str_00._M_str = (char *)rhs_elems.first._M_len;
      __str_00._M_len = (size_t)local_90;
      iVar3 = ::std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_60,__str_00);
      return iVar3;
    }
    local_c8 = (size_t)local_90;
    local_c0 = rhs_elems.first._M_len;
    __str._M_str = (char *)rhs_elems.first._M_len;
    __str._M_len = (size_t)local_90;
    local_b4 = ::std::basic_string_view<char,_std::char_traits<char>_>::compare
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_60,__str);
    if (local_b4 != 0) {
      return local_b4;
    }
    local_f8 = lhs_elems.first._M_str;
    local_f0 = lhs_elems.second._M_len;
    p_01._M_str = pcVar4;
    p_01._M_len = lhs_elems.second._M_len;
    lsplit_path(&local_e8,(libtorrent *)lhs_elems.first._M_str,p_01);
    ::std::
    pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::operator=((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                 *)local_60,&local_e8);
    p_02._M_str = pcVar4;
    p_02._M_len = rhs_elems.second._M_len;
    lsplit_path(&local_118,(libtorrent *)rhs_elems.first._M_str,p_02);
    ::std::
    pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::operator=((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                 *)local_90,&local_118);
  }
  return 0;
}

Assistant:

int path_compare(string_view const lhs, string_view const lfile
		, string_view const rhs, string_view const rfile)
	{
		for (auto lhs_elems = lsplit_path(lhs), rhs_elems = lsplit_path(rhs);
			!lhs_elems.first.empty() || !rhs_elems.first.empty();
			lhs_elems = lsplit_path(lhs_elems.second), rhs_elems = lsplit_path(rhs_elems.second))
		{
			if (lhs_elems.first.empty() || rhs_elems.first.empty())
			{
				if (lhs_elems.first.empty()) lhs_elems.first = lfile;
				if (rhs_elems.first.empty()) rhs_elems.first = rfile;
				return lhs_elems.first.compare(rhs_elems.first);
			}

			int const ret = lhs_elems.first.compare(rhs_elems.first);
			if (ret != 0) return ret;
		}
		return 0;
	}